

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O1

bool __thiscall stackjit::AssemblyImage::loadFunctionBody(AssemblyImage *this,string *function)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  pointer pcVar1;
  OpCodes opCode;
  char value_00;
  string *psVar2;
  undefined4 value_01;
  mapped_type *pmVar3;
  mapped_type *this_01;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var4;
  unsigned_long uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  pointer pcVar6;
  unsigned_long uVar7;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Hash_node_base *p_Var10;
  size_t *in_RCX;
  size_t *index;
  pointer pcVar11;
  pointer pcVar12;
  _Alloc_hider _Var13;
  _Hash_node_base *p_Var14;
  AssemblyImage *this_03;
  long lVar15;
  bool bVar16;
  string value;
  string local;
  string calledClassType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  BinaryData local_248;
  undefined1 local_230 [32];
  undefined1 local_210 [32];
  _Hash_node_base local_1f0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  _Alloc_hider local_1c8;
  char local_1b8 [16];
  unsigned_long local_1a8;
  float local_19c;
  string local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  string *local_158;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_148;
  unsigned_long local_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this_00 = &this->mFunctionBodyOffsets;
  local_150._M_cur =
       (__node_type *)
       std::
       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       ::find(&this_00->_M_h,function);
  if (local_150._M_cur != (__node_type *)0x0) {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,function);
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*pmVar3;
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mFunctions,function);
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)this;
    AssemblyImageLoader::loadAttributes_abi_cxx11_
              ((AttributeContainer *)local_210,(AssemblyImageLoader *)this,&local_248,in_RCX);
    local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)this_01;
    p_Var4 = &Loader::Function::attributes_abi_cxx11_(this_01)->_M_h;
    local_148 = &this_00->_M_h;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(p_Var4,local_210);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Loader::Attribute>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_210);
    uVar5 = anon_unknown_4::loadData<unsigned_long>
                      ((BinaryData *)
                       local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(size_t *)&local_248);
    if (uVar5 != 0) {
      do {
        (anonymous_namespace)::loadString_abi_cxx11_
                  ((string *)local_210,
                   (_anonymous_namespace_ *)
                   local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,&local_248,in_RCX);
        this_02 = Loader::Function::localTypes_abi_cxx11_
                            ((Function *)
                             local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_02,(string *)local_210);
        if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_));
        }
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    this_03 = (AssemblyImage *)
              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_158 = function;
    local_140 = anon_unknown_4::loadData<unsigned_long>
                          ((BinaryData *)
                           local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(size_t *)&local_248);
    if (local_140 != 0) {
      uVar5 = 0;
      do {
        index = (size_t *)
                (this_03->mImageData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
        pcVar11 = (this_03->mImageData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pcVar12 = pcVar11 + -(long)index;
        pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pcVar12 <=
            local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start) {
LAB_0015bff9:
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,pcVar12);
        }
        pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
        if (pcVar12 <=
            local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start + 1) goto LAB_0015bff9;
        opCode = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)index + 1];
        pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        switch(*(pointer)((long)index +
                         (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start)) {
        case '\0':
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          Loader::Instruction::make(opCode);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
          goto LAB_0015b970;
        case '\x01':
          local_1a8 = uVar5;
          if (pcVar12 <= pcVar6) goto LAB_0015bff9;
          pcVar1 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)index;
          pcVar11 = pcVar11 + (-3 - (long)(local_248.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + (long)index))
          ;
          lVar15 = 3;
          if ((pointer)0x2 < pcVar11) {
            pcVar11 = (pointer)0x3;
          }
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          memcpy((Instruction *)local_210,pcVar1 + 2,(size_t)(pcVar11 + 1));
          value_01 = local_210._0_4_;
          while( true ) {
            pcVar6 = pcVar6 + 1;
            bVar16 = lVar15 == 0;
            lVar15 = lVar15 + -1;
            if (bVar16) break;
            if (pcVar12 <= pcVar6) goto LAB_0015bff9;
          }
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          Loader::Instruction::makeWithInt((Instruction *)local_210,opCode,value_01);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
          goto LAB_0015bde6;
        case '\x02':
          local_1a8 = uVar5;
          if (pcVar12 <= pcVar6) goto LAB_0015bff9;
          pcVar1 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)index;
          pcVar11 = pcVar11 + (-3 - (long)(local_248.super__Vector_base<char,_std::allocator<char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + (long)index))
          ;
          lVar15 = 3;
          if ((pointer)0x2 < pcVar11) {
            pcVar11 = (pointer)0x3;
          }
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          memcpy((Instruction *)local_210,pcVar1 + 2,(size_t)(pcVar11 + 1));
          while( true ) {
            pcVar6 = pcVar6 + 1;
            bVar16 = lVar15 == 0;
            lVar15 = lVar15 + -1;
            if (bVar16) break;
            if (pcVar12 <= pcVar6) goto LAB_0015bff9;
          }
          local_19c = (float)local_210._0_4_;
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          Loader::Instruction::makeWithFloat(opCode,local_19c);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
LAB_0015bde6:
          if (local_1c8._M_p != local_1b8) {
            operator_delete(local_1c8._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
          uVar5 = local_1a8;
          pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((_Hash_node_base *)local_210._16_8_ != local_1f0) {
            operator_delete((void *)local_210._16_8_);
            uVar5 = local_1a8;
            pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          goto switchD_0015b7f9_default;
        case '\x03':
          if (pcVar12 <= pcVar6) goto LAB_0015bff9;
          value_00 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)index + 2];
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 3;
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          Loader::Instruction::makeWithChar((Instruction *)local_210,opCode,value_00);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
LAB_0015b970:
          if (local_1c8._M_p != local_1b8) {
            operator_delete(local_1c8._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
          p_Var10 = local_1f0;
          p_Var14 = (_Hash_node_base *)local_210._16_8_;
          goto LAB_0015bf82;
        case '\x04':
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          (anonymous_namespace)::loadString_abi_cxx11_
                    ((string *)local_230,(_anonymous_namespace_ *)this_03,&local_248,index);
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_230._0_8_,
                     (pointer)(local_230._0_8_ + local_230._8_8_));
          Loader::Instruction::makeWithString((Instruction *)local_210,opCode,&local_98);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
          if (local_1c8._M_p != local_1b8) {
            operator_delete(local_1c8._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
          if ((_Hash_node_base *)local_210._16_8_ != local_1f0) {
            operator_delete((void *)local_210._16_8_);
          }
          paVar9 = &local_98.field_2;
          _Var13._M_p = local_98._M_dataplus._M_p;
          break;
        case '\x05':
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          (anonymous_namespace)::loadString_abi_cxx11_
                    ((string *)local_230,(_anonymous_namespace_ *)this_03,&local_248,index);
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_230._0_8_,
                     (pointer)(local_230._0_8_ + local_230._8_8_));
          Loader::Instruction::makeWithStringConstant((Instruction *)local_210,opCode,&local_b8);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
          if (local_1c8._M_p != local_1b8) {
            operator_delete(local_1c8._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
          if ((_Hash_node_base *)local_210._16_8_ != local_1f0) {
            operator_delete((void *)local_210._16_8_);
          }
          paVar9 = &local_b8.field_2;
          _Var13._M_p = local_b8._M_dataplus._M_p;
          break;
        case '\x06':
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          (anonymous_namespace)::loadString_abi_cxx11_
                    ((string *)local_230,(_anonymous_namespace_ *)this_03,&local_248,index);
          uVar7 = anon_unknown_4::loadData<unsigned_long>(&this_03->mImageData,(size_t *)&local_248)
          ;
          local_198._M_dataplus._M_p = (pointer)0x0;
          local_198._M_string_length = 0;
          local_198.field_2._M_allocated_capacity = 0;
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            (anonymous_namespace)::loadString_abi_cxx11_
                      ((string *)local_210,(_anonymous_namespace_ *)this_03,&local_248,index);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
            if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_));
            }
          }
          pvVar8 = Loader::Function::instructions
                             ((Function *)
                              local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_230._0_8_,
                     (pointer)(local_230._0_8_ + local_230._8_8_));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_198);
          Loader::Instruction::makeCall((Instruction *)local_210,&local_d8,&local_48);
          std::vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
          ::emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
          if (local_1c8._M_p != local_1b8) {
            operator_delete(local_1c8._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
          if ((_Hash_node_base *)local_210._16_8_ != local_1f0) {
            operator_delete((void *)local_210._16_8_);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
          goto LAB_0015bf78;
        case '\a':
          local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar6;
          (anonymous_namespace)::loadString_abi_cxx11_
                    ((string *)local_230,(_anonymous_namespace_ *)this_03,&local_248,index);
          (anonymous_namespace)::loadString_abi_cxx11_
                    (&local_198,(_anonymous_namespace_ *)this_03,&local_248,index);
          uVar7 = anon_unknown_4::loadData<unsigned_long>(&this_03->mImageData,(size_t *)&local_248)
          ;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            (anonymous_namespace)::loadString_abi_cxx11_
                      ((string *)local_210,
                       (_anonymous_namespace_ *)
                       local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,&local_248,index);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_178,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
            if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_210 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_));
            }
          }
          if (opCode == NEW_OBJECT) {
            pvVar8 = Loader::Function::instructions
                               ((Function *)
                                local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish);
            this_03 = (AssemblyImage *)
                      local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_60,&local_178);
            Loader::Instruction::makeNewObject((Instruction *)local_210,&local_f8,&local_60);
            std::
            vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
            emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
            if (local_1c8._M_p != local_1b8) {
              operator_delete(local_1c8._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1e0);
            if ((_Hash_node_base *)local_210._16_8_ != local_1f0) {
              operator_delete((void *)local_210._16_8_);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_60);
            psVar2 = &local_f8;
            _Var13._M_p = local_f8._M_dataplus._M_p;
          }
          else {
            pvVar8 = Loader::Function::instructions
                               ((Function *)
                                local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish);
            this_03 = (AssemblyImage *)
                      local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,local_230._0_8_,
                       (pointer)(local_230._0_8_ + local_230._8_8_));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_78,&local_178);
            Loader::Instruction::makeCallInstance
                      ((Instruction *)local_210,&local_118,&local_138,&local_78);
            std::
            vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>::
            emplace_back<stackjit::Loader::Instruction>(pvVar8,(Instruction *)local_210);
            if (local_1c8._M_p != local_1b8) {
              operator_delete(local_1c8._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1e0);
            if ((_Hash_node_base *)local_210._16_8_ != local_1f0) {
              operator_delete((void *)local_210._16_8_);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            psVar2 = &local_118;
            _Var13._M_p = local_118._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p != &psVar2->field_2) {
            operator_delete(_Var13._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          paVar9 = &local_198.field_2;
          _Var13._M_p = local_198._M_dataplus._M_p;
          break;
        default:
          goto switchD_0015b7f9_default;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != paVar9) {
          operator_delete(_Var13._M_p);
        }
LAB_0015bf78:
        p_Var10 = (_Hash_node_base *)(local_230 + 0x10);
        p_Var14 = (_Hash_node_base *)local_230._0_8_;
LAB_0015bf82:
        pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (p_Var14 != p_Var10) {
          operator_delete(p_Var14);
          pcVar6 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
switchD_0015b7f9_default:
        local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar6;
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_140);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(local_148,local_158);
  }
  return local_150._M_cur != (__node_type *)0x0;
}

Assistant:

bool AssemblyImage::loadFunctionBody(std::string function) {
		if (mFunctionBodyOffsets.count(function) > 0) {
			auto bodyOffset = mFunctionBodyOffsets[function];

			Loader::Function& func = mFunctions[function];
			func.attributes() = AssemblyImageLoader::loadAttributes(mImageData, bodyOffset);

			auto numLocals = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numLocals; i++) {
				auto local = loadString(mImageData, bodyOffset);
				func.localTypes().push_back(local);
			}

			auto numInst = loadData<std::size_t>(mImageData, bodyOffset);
			for (std::size_t i = 0; i < numInst; i++) {
				auto format = (Loader::InstructionFormats)loadData<char>(mImageData, bodyOffset);
				auto opCode = (OpCodes)loadData<unsigned char>(mImageData, bodyOffset);

				switch (format) {
					case Loader::InstructionFormats::OpCodeOnly:
						func.instructions().push_back(Loader::Instruction::make(opCode));
						break;
					case Loader::InstructionFormats::IntData: {
							auto value = loadData<int>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithInt(opCode, value));
						}
						break;
					case Loader::InstructionFormats::FloatData:	{
							auto value = loadData<float>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithFloat(opCode, value));
						}
						break;
					case Loader::InstructionFormats::CharData: {
							auto value = loadData<char>(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithChar(opCode, value));
						}
						break;
					case Loader::InstructionFormats::StringData: {
							auto value = loadString(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithString(opCode, value));
						}
						break;
					case Loader::InstructionFormats::StringConstantData: {
							auto value = loadString(mImageData, bodyOffset);
							func.instructions().push_back(Loader::Instruction::makeWithStringConstant(opCode, value));
						}
						break;
					case Loader::InstructionFormats::Call: {
							auto funcName = loadString(mImageData, bodyOffset);
							auto numParams = loadData<std::size_t>(mImageData, bodyOffset);
							std::vector<std::string> params;

							for (std::size_t j = 0; j < numParams; j++) {
								params.push_back(loadString(mImageData, bodyOffset));
							}

							func.instructions().push_back(Loader::Instruction::makeCall(funcName, params));
						}
						break;
					case Loader::InstructionFormats::CallInstance: {
							auto funcName = loadString(mImageData, bodyOffset);
							auto calledClassType = loadString(mImageData, bodyOffset);
							auto numParams = loadData<std::size_t>(mImageData, bodyOffset);
							std::vector<std::string> params;

							for (std::size_t j = 0; j < numParams; j++) {
								params.push_back(loadString(mImageData, bodyOffset));
							}

							if (opCode == OpCodes::NEW_OBJECT) {
								func.instructions().push_back(Loader::Instruction::makeNewObject(
									calledClassType,
									params));
							} else {
								func.instructions().push_back(Loader::Instruction::makeCallInstance(
									calledClassType,
									funcName,
									params));
							}
						}
						break;
				}
			}

			mFunctionBodyOffsets.erase(function);
			return true;
		}

		return false;
	}